

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::F_formatter::format(F_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  uint uVar1;
  ulong value;
  long lVar2;
  scoped_pad p;
  scoped_pad local_60;
  format_int local_38;
  
  value = (msg->time).__d.__r % 1000000000;
  if ((this->super_flag_formatter).padinfo_.width_ == 0) {
    lVar2 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar1 = ((uint)lVar2 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    uVar1 = (uVar1 - (value < *(ulong *)(fmt::v5::internal::basic_data<void>::
                                         ZERO_OR_POWERS_OF_10_64 + (ulong)uVar1 * 8))) + 1;
    if (uVar1 < 9) {
      fmt::v5::internal::basic_buffer<char>::append<char>
                (&dest->super_basic_buffer<char>,"0000000000000000000",
                 "0000000000000000000" + (9 - (ulong)uVar1));
    }
    local_60.spaces_._M_len =
         (size_t)fmt::v5::format_int::format_decimal((format_int *)&local_60,value);
    lVar2 = (long)&local_60 - local_60.spaces_._M_len;
    if (lVar2 < -0x15) goto LAB_001b8cf3;
    fmt::v5::internal::basic_buffer<char>::append<char>
              (&dest->super_basic_buffer<char>,(char *)local_60.spaces_._M_len,
               (char *)(local_60.spaces_._M_len + lVar2 + 0x15));
  }
  else {
    scoped_pad::scoped_pad(&local_60,9,&(this->super_flag_formatter).padinfo_,dest);
    lVar2 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar1 = ((uint)lVar2 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    uVar1 = (uVar1 - (value < *(ulong *)(fmt::v5::internal::basic_data<void>::
                                         ZERO_OR_POWERS_OF_10_64 + (ulong)uVar1 * 8))) + 1;
    if (uVar1 < 9) {
      fmt::v5::internal::basic_buffer<char>::append<char>
                (&dest->super_basic_buffer<char>,"0000000000000000000",
                 "0000000000000000000" + (9 - (ulong)uVar1));
    }
    local_38.str_ = fmt::v5::format_int::format_decimal(&local_38,value);
    lVar2 = (long)&local_38 - (long)local_38.str_;
    if (lVar2 < -0x15) {
LAB_001b8cf3:
      __assert_fail("(value >= 0) && \"negative value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/core.h"
                    ,0xde,
                    "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                   );
    }
    fmt::v5::internal::basic_buffer<char>::append<char>
              (&dest->super_basic_buffer<char>,local_38.str_,local_38.str_ + lVar2 + 0x15);
    scoped_pad::~scoped_pad(&local_60);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        if (padinfo_.enabled())
        {
            const size_t field_size = 9;
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
        }
        else
        {
            fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
        }
    }